

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

Reference flexbuffers::GetRoot(uint8_t *buffer,size_t size)

{
  byte bVar1;
  Reference RVar2;
  
  bVar1 = buffer[size - 2];
  RVar2.data_ = buffer + (size - 2) + -(ulong)buffer[size - 1];
  RVar2._8_8_ = (1L << (bVar1 & 3)) << 8 | (ulong)(bVar1 >> 2) << 0x20 | (ulong)buffer[size - 1];
  return RVar2;
}

Assistant:

inline Reference GetRoot(const uint8_t *buffer, size_t size) {
  // See Finish() below for the serialization counterpart of this.
  // The root starts at the end of the buffer, so we parse backwards from there.
  auto end = buffer + size;
  auto byte_width = *--end;
  auto packed_type = *--end;
  end -= byte_width;  // The root data item.
  return Reference(end, byte_width, packed_type);
}